

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_st.c
# Opt level: O0

err_t cmdStBrng(void)

{
  bool_t bVar1;
  octet *poVar2;
  octet buf [96];
  octet state [1024];
  void *in_stack_fffffffffffffb78;
  undefined1 *dest;
  char *hex;
  octet *in_stack_fffffffffffffb98;
  void *in_stack_fffffffffffffba0;
  void *in_stack_fffffffffffffbb0;
  size_t in_stack_fffffffffffffbb8;
  void *in_stack_fffffffffffffbc0;
  char local_408 [1028];
  err_t local_4;
  
  dest = &stack0xfffffffffffffb98;
  beltH();
  memCopy(dest,in_stack_fffffffffffffb78,0x10c3aa);
  hex = local_408;
  poVar2 = beltH();
  poVar2 = poVar2 + 0x80;
  beltH();
  brngCTRStart(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,poVar2);
  brngCTRStepR(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  bVar1 = hexEq(poVar2,hex);
  if (bVar1 == 0) {
    local_4 = 0x20a;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static err_t cmdStBrng()
{
	octet state[1024];
	octet buf[96];
	// brng-ctr: тест Б.2
	ASSERT(sizeof(state) >= brngCTR_keep());
	memCopy(buf, beltH(), 96);
	brngCTRStart(state, beltH() + 128, beltH() + 128 + 64);
	brngCTRStepR(buf, 96, state);
	if (!hexEq(buf,
		"1F66B5B84B7339674533F0329C74F218"
		"34281FED0732429E0C79235FC273E269"
		"4C0E74B2CD5811AD21F23DE7E0FA742C"
		"3ED6EC483C461CE15C33A77AA308B7D2"
		"0F51D91347617C20BD4AB07AEF4F26A1"
		"AD1362A8F9A3D42FBE1B8E6F1C88AAD5"))
		return ERR_SELFTEST;
	return ERR_OK;
}